

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void fkScanChildren(Parse *pParse,SrcList *pSrc,Table *pTab,Index *pIdx,FKey *pFKey,int *aiCol,
                   int regData,int nIncr)

{
  int iVar1;
  sqlite3 *db_00;
  Column *pCVar2;
  Vdbe *p;
  Expr *pEVar3;
  Expr *pRight_00;
  WhereInfo *pWInfo_00;
  Parse *local_100;
  int local_f4;
  Expr *pRight_1;
  Expr *pLeft_1;
  Expr *pEq_1;
  char *zColl;
  Column *pCol;
  char *zCol;
  int iCol;
  Expr *pEq;
  Expr *pRight;
  Expr *pLeft;
  Vdbe *v;
  int iFkIfZero;
  WhereInfo *pWInfo;
  NameContext sNameContext;
  Expr *pWhere;
  int i;
  sqlite3 *db;
  int *aiCol_local;
  FKey *pFKey_local;
  Index *pIdx_local;
  Table *pTab_local;
  SrcList *pSrc_local;
  Parse *pParse_local;
  
  db_00 = pParse->db;
  sNameContext.ncFlags = '\0';
  sNameContext._49_7_ = 0;
  v._4_4_ = 0;
  p = sqlite3GetVdbe(pParse);
  if (nIncr < 0) {
    v._4_4_ = sqlite3VdbeAddOp2(p,0x76,(uint)pFKey->isDeferred,0);
  }
  for (pWhere._4_4_ = 0; pWhere._4_4_ < pFKey->nCol; pWhere._4_4_ = pWhere._4_4_ + 1) {
    pRight = sqlite3Expr(db_00,0x84,(char *)0x0);
    if (pRight != (Expr *)0x0) {
      if (pIdx == (Index *)0x0) {
        pRight->iTable = regData;
        pRight->affinity = 'd';
      }
      else {
        iVar1 = pIdx->aiColumn[pWhere._4_4_];
        pCVar2 = pTab->aCol;
        zCol._4_4_ = iVar1;
        if (pTab->iPKey == iVar1) {
          zCol._4_4_ = -1;
        }
        pRight->iTable = regData + zCol._4_4_ + 1;
        pRight->affinity = pCVar2[iVar1].affinity;
        pEq_1 = (Expr *)pCVar2[iVar1].zColl;
        if (pEq_1 == (Expr *)0x0) {
          pEq_1 = (Expr *)db_00->pDfltColl->zName;
        }
        pRight = sqlite3ExprAddCollateString(pParse,pRight,(char *)pEq_1);
      }
    }
    if (aiCol == (int *)0x0) {
      local_f4 = pFKey->aCol[0].iFrom;
    }
    else {
      local_f4 = aiCol[pWhere._4_4_];
    }
    pEVar3 = sqlite3Expr(db_00,0x1a,pFKey->pFrom->aCol[local_f4].zName);
    pEVar3 = sqlite3PExpr(pParse,0x4c,pRight,pEVar3,(Token *)0x0);
    sNameContext._48_8_ = sqlite3ExprAnd(db_00,(Expr *)sNameContext._48_8_,pEVar3);
  }
  if ((pTab == pFKey->pFrom) && (0 < nIncr)) {
    pEVar3 = sqlite3Expr(db_00,0x84,(char *)0x0);
    pRight_00 = sqlite3Expr(db_00,0x98,(char *)0x0);
    if ((pEVar3 != (Expr *)0x0) && (pRight_00 != (Expr *)0x0)) {
      pEVar3->iTable = regData;
      pEVar3->affinity = 'd';
      pRight_00->iTable = pSrc->a[0].iCursor;
      pRight_00->iColumn = -1;
    }
    pEVar3 = sqlite3PExpr(pParse,0x4b,pEVar3,pRight_00,(Token *)0x0);
    sNameContext._48_8_ = sqlite3ExprAnd(db_00,(Expr *)sNameContext._48_8_,pEVar3);
  }
  memset(&pWInfo,0,0x38);
  pWInfo = (WhereInfo *)pParse;
  sNameContext.pParse = (Parse *)pSrc;
  sqlite3ResolveExprNames((NameContext *)&pWInfo,(Expr *)sNameContext._48_8_);
  pWInfo_00 = sqlite3WhereBegin(pParse,pSrc,(Expr *)sNameContext._48_8_,(ExprList *)0x0,
                                (ExprList *)0x0,0,0);
  if ((0 < nIncr) && (pFKey->isDeferred == '\0')) {
    local_100 = pParse;
    if (pParse->pToplevel != (Parse *)0x0) {
      local_100 = pParse->pToplevel;
    }
    local_100->mayAbort = '\x01';
  }
  sqlite3VdbeAddOp2(p,0x75,(uint)pFKey->isDeferred,nIncr);
  if (pWInfo_00 != (WhereInfo *)0x0) {
    sqlite3WhereEnd(pWInfo_00);
  }
  sqlite3ExprDelete(db_00,(Expr *)sNameContext._48_8_);
  if (v._4_4_ != 0) {
    sqlite3VdbeJumpHere(p,v._4_4_);
  }
  return;
}

Assistant:

static void fkScanChildren(
  Parse *pParse,                  /* Parse context */
  SrcList *pSrc,                  /* SrcList containing the table to scan */
  Table *pTab,
  Index *pIdx,                    /* Foreign key index */
  FKey *pFKey,                    /* Foreign key relationship */
  int *aiCol,                     /* Map from pIdx cols to child table cols */
  int regData,                    /* Referenced table data starts here */
  int nIncr                       /* Amount to increment deferred counter by */
){
  sqlite3 *db = pParse->db;       /* Database handle */
  int i;                          /* Iterator variable */
  Expr *pWhere = 0;               /* WHERE clause to scan with */
  NameContext sNameContext;       /* Context used to resolve WHERE clause */
  WhereInfo *pWInfo;              /* Context used by sqlite3WhereXXX() */
  int iFkIfZero = 0;              /* Address of OP_FkIfZero */
  Vdbe *v = sqlite3GetVdbe(pParse);

  assert( !pIdx || pIdx->pTable==pTab );

  if( nIncr<0 ){
    iFkIfZero = sqlite3VdbeAddOp2(v, OP_FkIfZero, pFKey->isDeferred, 0);
  }

  /* Create an Expr object representing an SQL expression like:
  **
  **   <parent-key1> = <child-key1> AND <parent-key2> = <child-key2> ...
  **
  ** The collation sequence used for the comparison should be that of
  ** the parent key columns. The affinity of the parent key column should
  ** be applied to each child key value before the comparison takes place.
  */
  for(i=0; i<pFKey->nCol; i++){
    Expr *pLeft;                  /* Value from parent table row */
    Expr *pRight;                 /* Column ref to child table */
    Expr *pEq;                    /* Expression (pLeft = pRight) */
    int iCol;                     /* Index of column in child table */ 
    const char *zCol;             /* Name of column in child table */

    pLeft = sqlite3Expr(db, TK_REGISTER, 0);
    if( pLeft ){
      /* Set the collation sequence and affinity of the LHS of each TK_EQ
      ** expression to the parent key column defaults.  */
      if( pIdx ){
        Column *pCol;
        const char *zColl;
        iCol = pIdx->aiColumn[i];
        pCol = &pTab->aCol[iCol];
        if( pTab->iPKey==iCol ) iCol = -1;
        pLeft->iTable = regData+iCol+1;
        pLeft->affinity = pCol->affinity;
        zColl = pCol->zColl;
        if( zColl==0 ) zColl = db->pDfltColl->zName;
        pLeft = sqlite3ExprAddCollateString(pParse, pLeft, zColl);
      }else{
        pLeft->iTable = regData;
        pLeft->affinity = SQLITE_AFF_INTEGER;
      }
    }
    iCol = aiCol ? aiCol[i] : pFKey->aCol[0].iFrom;
    assert( iCol>=0 );
    zCol = pFKey->pFrom->aCol[iCol].zName;
    pRight = sqlite3Expr(db, TK_ID, zCol);
    pEq = sqlite3PExpr(pParse, TK_EQ, pLeft, pRight, 0);
    pWhere = sqlite3ExprAnd(db, pWhere, pEq);
  }

  /* If the child table is the same as the parent table, and this scan
  ** is taking place as part of a DELETE operation (operation D.2), omit the
  ** row being deleted from the scan by adding ($rowid != rowid) to the WHERE 
  ** clause, where $rowid is the rowid of the row being deleted.  */
  if( pTab==pFKey->pFrom && nIncr>0 ){
    Expr *pEq;                    /* Expression (pLeft = pRight) */
    Expr *pLeft;                  /* Value from parent table row */
    Expr *pRight;                 /* Column ref to child table */
    pLeft = sqlite3Expr(db, TK_REGISTER, 0);
    pRight = sqlite3Expr(db, TK_COLUMN, 0);
    if( pLeft && pRight ){
      pLeft->iTable = regData;
      pLeft->affinity = SQLITE_AFF_INTEGER;
      pRight->iTable = pSrc->a[0].iCursor;
      pRight->iColumn = -1;
    }
    pEq = sqlite3PExpr(pParse, TK_NE, pLeft, pRight, 0);
    pWhere = sqlite3ExprAnd(db, pWhere, pEq);
  }

  /* Resolve the references in the WHERE clause. */
  memset(&sNameContext, 0, sizeof(NameContext));
  sNameContext.pSrcList = pSrc;
  sNameContext.pParse = pParse;
  sqlite3ResolveExprNames(&sNameContext, pWhere);

  /* Create VDBE to loop through the entries in pSrc that match the WHERE
  ** clause. If the constraint is not deferred, throw an exception for
  ** each row found. Otherwise, for deferred constraints, increment the
  ** deferred constraint counter by nIncr for each row selected.  */
  pWInfo = sqlite3WhereBegin(pParse, pSrc, pWhere, 0, 0, 0, 0);
  if( nIncr>0 && pFKey->isDeferred==0 ){
    sqlite3ParseToplevel(pParse)->mayAbort = 1;
  }
  sqlite3VdbeAddOp2(v, OP_FkCounter, pFKey->isDeferred, nIncr);
  if( pWInfo ){
    sqlite3WhereEnd(pWInfo);
  }

  /* Clean up the WHERE clause constructed above. */
  sqlite3ExprDelete(db, pWhere);
  if( iFkIfZero ){
    sqlite3VdbeJumpHere(v, iFkIfZero);
  }
}